

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
* soul::Compiler::parseTopLevelDeclarations
            (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *__return_storage_ptr__,Allocator *allocator,CodeLocation *code,
            Namespace *parentNamespace)

{
  CodeLocation local_38;
  Namespace *local_28;
  Namespace *parentNamespace_local;
  CodeLocation *code_local;
  Allocator *allocator_local;
  
  local_28 = parentNamespace;
  parentNamespace_local = (Namespace *)code;
  code_local = (CodeLocation *)allocator;
  allocator_local = (Allocator *)__return_storage_ptr__;
  CodeLocation::CodeLocation(&local_38,code);
  StructuralParser::parseTopLevelDeclarations(__return_storage_ptr__,allocator,&local_38,local_28);
  CodeLocation::~CodeLocation(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<AST::ModuleBase>> Compiler::parseTopLevelDeclarations (AST::Allocator& allocator, CodeLocation code,
                                                                            AST::Namespace& parentNamespace)
{
    return StructuralParser::parseTopLevelDeclarations (allocator, code, parentNamespace);
}